

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<true,false,false,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  ostream *poVar3;
  float *pfVar4;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  float in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar5;
  uint in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  uint uVar6;
  undefined4 in_stack_fffffffffffffe14;
  size_t in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  learner<char,_example> *in_stack_fffffffffffffe30;
  uint local_1ac;
  stringstream local_1a8 [392];
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar3 = std::operator<<((ostream *)&std::cout,"label ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_20);
    poVar3 = std::operator<<(poVar3," is not in {1,");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_8);
    poVar3 = std::operator<<(poVar3,"} This won\'t work right.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            (in_stack_fffffffffffffe30,(example *)0x0,CONCAT44(0x7f7fffff,in_stack_fffffffffffffe20)
             ,in_stack_fffffffffffffe18,
             (polyprediction *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             SUB41(in_stack_fffffffffffffe0c >> 0x18,0));
  for (uVar6 = 2; (ulong)uVar6 <= *local_8; uVar6 = uVar6 + 1) {
    fVar1 = *(float *)(local_8[2] + (ulong)(uVar6 - 1) * 0x20);
    pfVar4 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar4 <= fVar1 && fVar1 != *pfVar4) {
      local_1ac = uVar6;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (in_stack_fffffffffffffe0c = 1; (ulong)in_stack_fffffffffffffe0c <= *local_8;
        in_stack_fffffffffffffe0c = in_stack_fffffffffffffe0c + 1) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_fffffffffffffe14,uVar6),
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc);
    }
  }
  for (uVar5 = 1; (ulong)uVar5 <= *local_8; uVar5 = uVar5 + 1) {
    uVar2 = *(uint *)(&DAT_003ecdc4 + (ulong)((uint)local_20 == uVar5) * 4);
    *(undefined4 *)(local_18 + 0x6830) = 0;
    *(ulong *)(local_18 + 0x6828) = (ulong)uVar2;
    *(undefined4 *)(local_18 + 0x6850) = *(undefined4 *)(local_8[2] + (ulong)(uVar5 - 1) * 0x20);
    LEARNER::learner<char,_example>::update
              ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffe14,uVar6),
               (example *)CONCAT44(in_stack_fffffffffffffe0c,uVar5),0);
  }
  *(uint *)(local_18 + 0x6850) = local_1ac;
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}